

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void iterator_suite::test_const_iterator(void)

{
  size_type *this;
  initializer_list<int> __l;
  bool v;
  iterator begin;
  iterator end;
  iterator second_begin;
  iterator second_end;
  const_iterator first_begin;
  const_iterator first_end;
  allocator<int> local_85;
  int local_84;
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> expect;
  const_iterator local_48;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  array<int,_4UL> array;
  
  span.member.next = 0;
  this = &span.member.next;
  begin = std::array<int,_4UL>::begin((array<int,_4UL> *)this);
  end = std::array<int,_4UL>::end((array<int,_4UL> *)this);
  vista::circular_view<int,18446744073709551615ul>::circular_view<int*>
            ((circular_view<int,18446744073709551615ul> *)local_38,begin,end);
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0xb);
  local_48 = vista::circular_view<int,_18446744073709551615UL>::cbegin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  join_0x00000010_0x00000000_ =
       vista::circular_view<int,_18446744073709551615UL>::cend
                 ((circular_view<int,_18446744073709551615UL> *)local_38);
  v = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<const_int>::operator!=
                (&local_48,
                 (iterator_type *)
                 &expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  boost::detail::test_impl
            ("span.cbegin() != span.cend()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x28c,"void iterator_suite::test_const_iterator()",v);
  local_84 = 0xb;
  local_80 = &local_84;
  local_78 = 1;
  std::allocator<int>::allocator(&local_85);
  __l._M_len = local_78;
  __l._M_array = local_80;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__l,&local_85);
  std::allocator<int>::~allocator(&local_85);
  first_begin = vista::circular_view<int,_18446744073709551615UL>::cbegin
                          ((circular_view<int,_18446744073709551615UL> *)local_38);
  first_end = vista::circular_view<int,_18446744073709551615UL>::cend
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  second_begin = std::vector<int,_std::allocator<int>_>::begin
                           ((vector<int,_std::allocator<int>_> *)local_70);
  second_end = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_70);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int_const>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x290,"void iterator_suite::test_const_iterator()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_begin._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             second_end._M_current);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  return;
}

Assistant:

void test_const_iterator()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    span.push_back(11);
    BOOST_TEST(span.cbegin() != span.cend());
    {
        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.cbegin(), span.cend(),
                          expect.begin(), expect.end());
    }
}